

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat2Expanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  bool bVar1;
  qpTestResult qVar2;
  long (*palVar3) [2];
  GLint64 GVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Hex<16UL> local_238;
  Hex<16UL> local_230;
  Hex<16UL> local_228;
  Hex<16UL> local_220;
  Hex<16UL> local_218;
  Hex<16UL> local_210 [3];
  MessageBuilder local_1f8;
  long local_78;
  GLint64 referenceAsGLintMax [2];
  GLint64 referenceAsGLintMin [2];
  StateQueryMemoryWriteGuard<long[2]> floatVector2;
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[2]> *)(referenceAsGLintMin + 1));
  palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1));
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*palVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[2]> *)(referenceAsGLintMin + 1),testCtx);
  if (bVar1) {
    GVar4 = anon_unknown_0::expandGLFloatToInteger(reference0);
    referenceAsGLintMax[1] = GVar4 + -0x7ff;
    GVar4 = anon_unknown_0::expandGLFloatToInteger(reference1);
    referenceAsGLintMin[0] = GVar4 + -0x7ff;
    GVar4 = anon_unknown_0::expandGLFloatToInteger(reference0);
    local_78 = GVar4 + 0x7ff;
    GVar4 = anon_unknown_0::expandGLFloatToInteger(reference1);
    referenceAsGLintMax[0] = GVar4 + 0x7ff;
    palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1));
    if (((((*palVar3)[0] < referenceAsGLintMax[1]) ||
         (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer
                              ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1)),
         local_78 < (*palVar3)[0])) ||
        (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer
                             ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1)),
        (*palVar3)[1] < referenceAsGLintMin[0])) ||
       (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer
                            ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1)),
       referenceAsGLintMax[0] < (*palVar3)[1])) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1f8,(char (*) [30])"// ERROR: expected in ranges ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b01e3);
      local_210[0] = tcu::toHex<long>(referenceAsGLintMax[1]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_210);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12fecfb);
      local_218 = tcu::toHex<long>(local_78);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_218);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12746c5);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b01e3);
      local_220 = tcu::toHex<long>(referenceAsGLintMin[0]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_220);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12fecfb);
      local_228 = tcu::toHex<long>(referenceAsGLintMax[0]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_228);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12a9f4e);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x12a3d6f);
      palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1));
      local_230 = tcu::toHex<long>((*palVar3)[0]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_230);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x12ed2ef);
      palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)(referenceAsGLintMin + 1));
      local_238 = tcu::toHex<long>((*palVar3)[1]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_238);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12fecfb);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f8);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	StateQueryMemoryWriteGuard<GLint64[2]> floatVector2;
	glGetInteger64v(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64
	};

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}